

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_unix.cpp
# Opt level: O0

int __thiscall File::open(File *this,char *__file,int __oflag,...)

{
  char *__s;
  bool bVar1;
  int fd_00;
  void *pvVar2;
  uint in_ECX;
  int fd;
  allocator<char> local_69;
  string local_68;
  string local_48;
  uint local_24;
  uint local_20;
  int sysFlags;
  uint systemDependentFlags_local;
  uint oflag_local;
  char *fName_local;
  File *this_local;
  
  local_20 = in_ECX;
  sysFlags = __oflag;
  _systemDependentFlags_local = __file;
  fName_local = (char *)this;
  std::__cxx11::string::operator=((string *)&this->m_name,__file);
  bVar1 = isOpen(this);
  if (bVar1) {
    (*(this->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])();
  }
  local_24 = anon_unknown.dwarf_2ffb82::makeUnixOpenFlags(sysFlags);
  __s = _systemDependentFlags_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_69);
  extractFileDir(&local_48,&local_68);
  createDir(&local_48,true);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  fd_00 = open64(_systemDependentFlags_local,local_24 | local_20,0x1b0);
  pvVar2 = anon_unknown.dwarf_2ffb82::from_fd(fd_00);
  this->m_impl = pvVar2;
  return (int)CONCAT71((int7)((ulong)this >> 8),fd_00 != -1);
}

Assistant:

bool File::open(const char* fName, unsigned int oflag, unsigned int systemDependentFlags)
{
    m_name = fName;

    if (isOpen())
        close();

    int sysFlags = makeUnixOpenFlags(oflag);
    createDir(extractFileDir(fName), true);
    auto fd = ::open(fName, sysFlags | systemDependentFlags, S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP);
    m_impl = from_fd(fd);
    return fd != -1;
}